

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

bool __thiscall cmNinjaTargetGenerator::ForceResponseFile(cmNinjaTargetGenerator *this)

{
  bool bVar1;
  int iVar2;
  cmMakefile *this_00;
  bool local_39;
  allocator<char> local_11;
  cmNinjaTargetGenerator *local_10;
  cmNinjaTargetGenerator *this_local;
  
  local_10 = this;
  if (ForceResponseFile()::forceRspFile_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&ForceResponseFile()::forceRspFile_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ForceResponseFile()::forceRspFile_abi_cxx11_,
                 "CMAKE_NINJA_FORCE_RESPONSE_FILE",&local_11);
      std::allocator<char>::~allocator(&local_11);
      __cxa_atexit(std::__cxx11::string::~string,&ForceResponseFile()::forceRspFile_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ForceResponseFile()::forceRspFile_abi_cxx11_);
    }
  }
  this_00 = GetMakefile(this);
  bVar1 = cmMakefile::IsDefinitionSet(this_00,&ForceResponseFile()::forceRspFile_abi_cxx11_);
  local_39 = true;
  if (!bVar1) {
    local_39 = cmsys::SystemTools::HasEnv(&ForceResponseFile()::forceRspFile_abi_cxx11_);
  }
  return local_39;
}

Assistant:

bool cmNinjaTargetGenerator::ForceResponseFile()
{
  static std::string const forceRspFile = "CMAKE_NINJA_FORCE_RESPONSE_FILE";
  return (this->GetMakefile()->IsDefinitionSet(forceRspFile) ||
          cmSystemTools::HasEnv(forceRspFile));
}